

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer ppTVar1;
  byte bVar2;
  undefined8 uVar3;
  pointer ppFVar4;
  bool bVar5;
  int iVar6;
  __pid_t _Var7;
  __pid_t _Var8;
  undefined8 *puVar9;
  Module *pMVar10;
  FunctionType *pFVar11;
  IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *pIVar12;
  reference ppTVar13;
  reference ppVVar14;
  LoadInst *this;
  ulong uVar15;
  arg_iterator this_00;
  arg_iterator pAVar16;
  Value *pVVar17;
  Type *pTVar18;
  BasicBlock *pBVar19;
  Function *pFVar20;
  ret_type this_01;
  reference BB;
  Twine *pTVar21;
  undefined1 auVar22 [8];
  ValueHandleBase *this_02;
  Pass *pPVar23;
  ostream *poVar24;
  raw_ostream *prVar25;
  undefined8 extraout_RAX;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *pvVar26;
  int W;
  int W_00;
  int i_1;
  uint uVar27;
  long lVar28;
  uint uVar29;
  IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *this_03;
  Function *pFVar30;
  Instruction *Val;
  char *pcVar31;
  int i;
  int this_04 [2];
  long lVar32;
  Function *pFVar33;
  BranchInst **bi;
  undefined8 *puVar34;
  Function *pFVar35;
  Module *pMVar36;
  StringRef T;
  StringRef SVar37;
  iterator_range<llvm::Argument_*> iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [12];
  uint in_stack_fffffffffffffcec;
  PrettyStackTraceProgram in_stack_fffffffffffffcf0;
  PrettyStackTraceProgram X;
  undefined1 local_2f0 [8];
  inst_iterator p_1;
  undefined1 auStack_168 [8];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> ArgsTy;
  string *local_128;
  undefined1 local_120 [8];
  inst_iterator pe;
  pred_iterator pStack_f8;
  pred_iterator PI;
  int local_d0;
  int local_cc;
  int p [2];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> RealArgsTy;
  undefined1 auStack_88 [8];
  vector<llvm::Function_*,_std::allocator<llvm::Function_*>_> Funcs;
  int local_68 [2];
  int Budget;
  undefined1 auStack_58 [8];
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> MT;
  allocator<char> local_31;
  
  llvm::PrettyStackTraceProgram::PrettyStackTraceProgram
            ((PrettyStackTraceProgram *)&stack0xfffffffffffffcf0,argc,argv);
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,(int)argv,(char **)"llvm codegen stress-tester\n",
             (StringRef)ZEXT816(0x1b),(raw_ostream *)0x0,
             (char *)((ulong)in_stack_fffffffffffffcec << 0x20),(bool)in_stack_fffffffffffffcf0);
  if ((int)(anonymous_namespace)::W._128_4_ < 2) {
    pcVar31 = "Width must be >= 2";
LAB_0026586b:
    anon_unknown.dwarf_232db::die(pcVar31);
LAB_00265870:
    pcVar31 = "atexit failed";
LAB_00265880:
    anon_unknown.dwarf_232db::die(pcVar31);
LAB_00265885:
    anon_unknown.dwarf_232db::die("open failed");
  }
  else {
    puVar9 = (undefined8 *)mmap((void *)0x0,0x1498,3,0x21,-1,0);
    (anonymous_namespace)::Shmem = puVar9;
    if (puVar9 == (undefined8 *)0xffffffffffffffff) {
      pcVar31 = "mmap failed";
      goto LAB_0026586b;
    }
    LOCK();
    *puVar9 = 1;
    UNLOCK();
    *(undefined4 *)((long)puVar9 + 0x148c) = 1;
    iVar6 = pthread_mutexattr_init((pthread_mutexattr_t *)(puVar9 + 6));
    if (iVar6 != 0) {
      pcVar31 = "pthread_mutexattr_init failed";
      goto LAB_0026586b;
    }
    iVar6 = pthread_mutexattr_setpshared
                      ((pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6),1);
    if (iVar6 != 0) {
      pcVar31 = "pthread_mutexattr_setpshared failed";
      goto LAB_0026586b;
    }
    iVar6 = pthread_mutex_init((pthread_mutex_t *)((anonymous_namespace)::Shmem + 1),
                               (pthread_mutexattr_t *)((anonymous_namespace)::Shmem + 6));
    if (iVar6 != 0) {
      pcVar31 = "pthread_mutex_init failed";
      goto LAB_0026586b;
    }
    iVar6 = pthread_condattr_init((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
    if (iVar6 != 0) {
      pcVar31 = "pthread_condattr_init failed";
      goto LAB_0026586b;
    }
    iVar6 = pthread_condattr_setpshared
                      ((pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291),1);
    if (iVar6 != 0) {
      pcVar31 = "pthread_condattr_setpshared failed";
      goto LAB_0026586b;
    }
    lVar32 = 0x38;
    for (lVar28 = 0x4be; lVar28 != 0x522; lVar28 = lVar28 + 1) {
      iVar6 = pthread_cond_init((pthread_cond_t *)((long)(anonymous_namespace)::Shmem + lVar32),
                                (pthread_condattr_t *)((anonymous_namespace)::Shmem + 0x291));
      if (iVar6 != 0) goto LAB_0026581b;
      *(undefined4 *)((long)(anonymous_namespace)::Shmem + lVar28 * 4) = 0;
      lVar32 = lVar32 + 0x30;
    }
    (anonymous_namespace)::Init = 1;
    _Var7 = getpid();
    iVar6 = atexit(anon_unknown.dwarf_232db::decrease_runners);
    if (iVar6 != 0) goto LAB_00265870;
    iVar6 = pipe(&local_d0);
    if (iVar6 != 0) {
      pcVar31 = "pipe failed??";
      goto LAB_00265880;
    }
    pMVar10 = (Module *)operator_new(800);
    llvm::Module::Module
              (pMVar10,(StringRef)ZEXT816(0x81b82a),(LLVMContext *)&(anonymous_namespace)::C);
    (anonymous_namespace)::M = pMVar10;
    if ((anonymous_namespace)::ARM64[0x80] == '\x01') {
      T.Length = 0x19;
      T.Data = "aarch64-unknown-linux-gnu";
      llvm::Module::setTargetTriple(pMVar10,T);
      SVar37.Length = 0x33;
      SVar37.Data = "e-m:e-i8:8:32-i16:16:32-i64:64-i128:128-n32:64-S128";
      llvm::Module::setDataLayout((anonymous_namespace)::M,SVar37);
    }
    auStack_168 = (undefined1  [8])0x0;
    ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    p[0] = 0;
    p[1] = 0;
    RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    MT.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    for (iVar6 = 0; iVar6 < (anonymous_namespace)::N._128_4_ + 2; iVar6 = iVar6 + 1) {
      anon_unknown.dwarf_232db::makeArg
                ((anonymous_namespace)::W._128_4_,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p);
      anon_unknown.dwarf_232db::makeArg
                ((anonymous_namespace)::W._128_4_,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p);
      anon_unknown.dwarf_232db::makeArg
                (1,(vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p);
      anon_unknown.dwarf_232db::makeArg
                ((int)(anonymous_namespace)::W._128_4_ / 2,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p);
      anon_unknown.dwarf_232db::makeArg
                ((anonymous_namespace)::W._128_4_ * 2,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                 (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p);
    }
    uVar27 = 1;
    if ((anonymous_namespace)::Geni1[0x80] == '\0') {
      uVar27 = (anonymous_namespace)::W._128_4_;
    }
    uVar29 = uVar27;
    if ((int)uVar27 < (int)(anonymous_namespace)::Promote._128_4_) {
      uVar29 = (anonymous_namespace)::Promote._128_4_;
    }
    if ((anonymous_namespace)::Promote._128_4_ == -1) {
      uVar29 = uVar27;
    }
    pFVar11 = (FunctionType *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar29)
    ;
    pvVar26 = (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p;
    if ((anonymous_namespace)::ArgsFromMem[0x80] != '\0') {
      pvVar26 = (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_58;
    }
    ppTVar1 = (pvVar26->super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pFVar11 = (FunctionType *)
              llvm::FunctionType::get
                        (pFVar11,ppTVar1,
                         (long)(pvVar26->
                               super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3,0);
    llvm::Twine::Twine((Twine *)local_2f0,
                       (string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80));
    (anonymous_namespace)::F =
         llvm::Function::Create(pFVar11,ExternalLinkage,(Twine *)local_2f0,(anonymous_namespace)::M)
    ;
    llvm::Twine::Twine((Twine *)local_2f0,"");
    local_120 = (undefined1  [8])
                llvm::BasicBlock::Create
                          ((LLVMContext *)&(anonymous_namespace)::C,(Twine *)local_2f0,
                           (anonymous_namespace)::F,(BasicBlock *)0x0);
    std::vector<llvm::BasicBlock*,std::allocator<llvm::BasicBlock*>>::
    emplace_back<llvm::BasicBlock*>
              ((vector<llvm::BasicBlock*,std::allocator<llvm::BasicBlock*>> *)
               &(anonymous_namespace)::BBs,(BasicBlock **)local_120);
    pIVar12 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)operator_new(0x88);
    pvVar26 = (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)0x0;
    llvm::IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter>::IRBuilder
              (pIVar12,(BasicBlock *)*(anonymous_namespace)::BBs,(MDNode *)0x0,
               (ArrayRef<llvm::OperandBundleDefT<llvm::Value_*>_>)ZEXT816(0));
    local_68[0] = (anonymous_namespace)::N._128_4_;
    pBVar19 = (BasicBlock *)*(anonymous_namespace)::BBs;
    (anonymous_namespace)::Builder = pIVar12;
    (pIVar12->super_IRBuilderBase).BB = pBVar19;
    (pIVar12->super_IRBuilderBase).InsertPt.NodePtr = (node_pointer)(pBVar19 + 0x28);
    if ((anonymous_namespace)::ArgsFromMem[0x80] == '\x01') {
      for (uVar27 = 0; pIVar12 = (anonymous_namespace)::Builder, uVar15 = (ulong)uVar27,
          uVar15 < (ulong)((long)ArgsTy.
                                 super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start - (long)auStack_168 >> 3);
          uVar27 = uVar27 + 1) {
        ppTVar13 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::at
                             ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p,uVar15);
        pTVar18 = *ppTVar13;
        ppVVar14 = std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::at
                             ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                              (anonymous_namespace)::globs,uVar15);
        pVVar17 = *ppVVar14;
        llvm::Twine::Twine((Twine *)local_2f0,"");
        pTVar21 = (Twine *)local_2f0;
        this = llvm::IRBuilderBase::CreateLoad
                         (&pIVar12->super_IRBuilderBase,pTVar18,pVVar17,(Twine *)local_2f0);
        ppTVar13 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::at
                             ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                              uVar15);
        auVar40 = llvm::Type::getPrimitiveSizeInBits(*ppTVar13);
        p_1.BBs._0_4_ = auVar40._8_4_;
        local_2f0 = auVar40._0_8_;
        uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f0);
        anon_unknown.dwarf_232db::addArg
                  ((anon_unknown_dwarf_232db *)this,(Value *)(uVar15 & 0xffffffff),W,
                   (vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)pTVar21);
      }
    }
    else {
      this_00 = llvm::Function::arg_begin((anonymous_namespace)::F);
      uVar27 = 0;
      for (; pAVar16 = llvm::Function::arg_end((anonymous_namespace)::F), this_00 != pAVar16;
          this_00 = (arg_iterator)((anon_unknown_dwarf_232db *)this_00 + 0x28)) {
        ppTVar13 = std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::at
                             ((vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168,
                              (ulong)uVar27);
        auVar40 = llvm::Type::getPrimitiveSizeInBits(*ppTVar13);
        p_1.BBs._0_4_ = auVar40._8_4_;
        local_2f0 = auVar40._0_8_;
        uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f0);
        anon_unknown.dwarf_232db::addArg
                  ((anon_unknown_dwarf_232db *)this_00,(Value *)(uVar15 & 0xffffffff),W_00,pvVar26);
        uVar27 = uVar27 + 1;
      }
    }
    iVar6 = (anonymous_namespace)::W._128_4_;
    if ((anonymous_namespace)::Geni1[0x80] != '\0') {
      iVar6 = 1;
    }
    pVVar17 = anon_unknown.dwarf_232db::genVal(local_68,iVar6,false,false);
    auVar40 = llvm::Type::getPrimitiveSizeInBits(*(Type **)pVVar17);
    p_1.BBs._0_4_ = auVar40._8_4_;
    local_2f0 = auVar40._0_8_;
    uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)local_2f0);
    pIVar12 = (anonymous_namespace)::Builder;
    if (uVar15 < uVar29) {
      pTVar18 = (Type *)llvm::Type::getIntNTy
                                  ((LLVMContext *)&(anonymous_namespace)::C,
                                   (anonymous_namespace)::Promote._128_4_);
      llvm::Twine::Twine((Twine *)local_2f0,"");
      pVVar17 = llvm::IRBuilderBase::CreateZExt
                          (&pIVar12->super_IRBuilderBase,pVVar17,pTVar18,(Twine *)local_2f0);
    }
    pIVar12 = (anonymous_namespace)::Builder;
    llvm::IRBuilderBase::CreateRet(&(anonymous_namespace)::Builder->super_IRBuilderBase,pVVar17);
    puVar9 = DAT_00938078;
    for (puVar34 = (anonymous_namespace)::Branches; puVar34 != puVar9; puVar34 = puVar34 + 1) {
      pBVar19 = anon_unknown.dwarf_232db::chooseTarget((BasicBlock *)pIVar12);
      pIVar12 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)*puVar34;
      llvm::BranchInst::setSuccessor((BranchInst *)pIVar12,0,pBVar19);
      this_03 = (IRBuilder<llvm::NoFolder,_llvm::IRBuilderDefaultInserter> *)*puVar34;
      if ((*(uint *)((this_03->super_IRBuilderBase).MetadataToCopy.
                     super_SmallVectorStorage<std::pair<unsigned_int,_llvm::MDNode_*>,_2U>.
                     InlineElts + 4) & 0x7ffffff) == 3) {
        pBVar19 = anon_unknown.dwarf_232db::chooseTarget((BasicBlock *)pIVar12);
        llvm::BranchInst::setSuccessor((BranchInst *)this_03,1,pBVar19);
        pIVar12 = this_03;
      }
    }
LAB_0026508f:
    for (pFVar20 = (anonymous_namespace)::F + 0x50; pFVar20 = *(Function **)pFVar20,
        pFVar20 != (anonymous_namespace)::F + 0x48; pFVar20 = pFVar20 + 8) {
      pFVar33 = pFVar20 + -0x18;
      if (pFVar20 == (Function *)0x0) {
        pFVar33 = (Function *)0x0;
      }
      pFVar30 = pFVar33 + 0x30;
      bVar2 = 0;
      while (pFVar30 = *(Function **)pFVar30, pFVar30 != pFVar33 + 0x28) {
        pFVar35 = pFVar30 + -0x18;
        if (pFVar30 == (Function *)0x0) {
          pFVar35 = (Function *)0x0;
        }
        bVar5 = (bool)(pFVar35[0x10] == (Function)0x52 & bVar2);
        pFVar30 = pFVar30 + 8;
        bVar2 = pFVar35[0x10] != (Function)0x52 | bVar2;
        if (bVar5) {
          pBVar19 = *(BasicBlock **)(pFVar35 + 0x28);
          llvm::Twine::Twine((Twine *)local_2f0,"phisp");
          llvm::BasicBlock::splitBasicBlock(pBVar19,pFVar35 + 0x18,(Twine *)local_2f0,0);
          goto LAB_0026508f;
        }
      }
    }
    llvm::
    InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
    ::InstIterator<llvm::Function>
              ((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                *)local_2f0,(anonymous_namespace)::F);
    local_120 = (undefined1  [8])((anonymous_namespace)::F + 0x48);
    pe.BB.NodePtr = (node_pointer)0x0;
    pe.BBs = (SymbolTableList<llvm::BasicBlock> *)local_120;
    while (bVar5 = llvm::
                   InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                   ::operator!=((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                 *)local_2f0,
                                (InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                                 *)local_120), bVar5) {
      Val = (Instruction *)&p_1.BB.NodePtr[-2].super_node_base_type.Next;
      if (p_1.BB.NodePtr == (node_pointer)0x0) {
        Val = (Instruction *)0x0;
      }
      this_01 = llvm::dyn_cast<llvm::PHINode,llvm::Instruction>(Val);
      if (this_01 != (ret_type)0x0) {
        pStack_f8 = llvm::pred_begin(*(BasicBlock **)&this_01->field_0x28);
        while (pStack_f8.It.UI.U != (use_iterator_impl<llvm::Use>)0x0) {
          BB = llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
               operator*(&stack0xffffffffffffff08);
          if (local_68[0] != 0) {
            anon_unknown.dwarf_232db::die("Budget == 0 failed at line __LINE__");
            goto LAB_0026581b;
          }
          auVar40 = llvm::Type::getPrimitiveSizeInBits(*(Type **)this_01);
          auStack_88 = auVar40._0_8_;
          Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(Funcs.
                                 super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,auVar40._8_4_);
          uVar15 = llvm::TypeSize::operator_cast_to_unsigned_long((TypeSize *)auStack_88);
          pVVar17 = anon_unknown.dwarf_232db::genVal(local_68,(int)uVar15,true,false);
          llvm::PHINode::addIncoming(this_01,pVVar17,BB);
          llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
          operator++(&stack0xffffffffffffff08);
        }
      }
      llvm::
      InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
      ::operator++((InstIterator<llvm::SymbolTableList<llvm::BasicBlock>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>,_llvm::Instruction>
                    *)local_2f0);
    }
    pFVar33 = (anonymous_namespace)::F + 0x48;
    bVar5 = true;
    for (pFVar20 = (anonymous_namespace)::F + 0x50; pFVar20 = *(Function **)pFVar20,
        pFVar20 != pFVar33; pFVar20 = pFVar20 + 8) {
      if (!bVar5) {
        pFVar30 = pFVar20 + -0x18;
        if (pFVar20 == (Function *)0x0) {
          pFVar30 = (Function *)0x0;
        }
        local_2f0 = (undefined1  [8])llvm::pred_begin((BasicBlock *)pFVar30);
        iVar6 = 0;
        while (local_2f0 != (undefined1  [8])0x0) {
          llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
          operator++((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> *
                     )local_2f0);
          iVar6 = iVar6 + -1;
        }
        if (iVar6 == 0) goto LAB_00265827;
      }
      bVar5 = false;
    }
    std::_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~_Vector_base
              ((_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_58);
    std::_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~_Vector_base
              ((_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)p);
    std::_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>::~_Vector_base
              ((_Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_> *)auStack_168);
    local_120 = (undefined1  [8])&pe.BB;
    pe.BBs = (SymbolTableList<llvm::BasicBlock> *)0x0;
    pe.BB.NodePtr = (node_pointer)((ulong)pe.BB.NodePtr & 0xffffffffffffff00);
    llvm::raw_string_ostream::raw_string_ostream
              ((raw_string_ostream *)auStack_168,(string *)local_120);
    llvm::legacy::PassManager::PassManager((PassManager *)local_68);
    if ((anonymous_namespace)::RemoveUnusedArgs[0x80] == '\x01') {
      auStack_88 = (undefined1  [8])0x0;
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pMVar36 = (anonymous_namespace)::M + 0x18;
      for (pMVar10 = (anonymous_namespace)::M + 0x20;
          ppFVar4 = Funcs.super__Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start, pMVar10 = *(Module **)pMVar10,
          pMVar10 != pMVar36; pMVar10 = pMVar10 + 8) {
        pTVar21 = (Twine *)(pMVar10 + -0x38);
        if (pMVar10 == (Module *)0x0) {
          pTVar21 = (Twine *)0x0;
        }
        if ((pTVar21[2].RHS.twine != (Twine *)0x0) && ((pTVar21->RHSKind & 0x20) == NullKind)) {
          local_2f0 = (undefined1  [8])pTVar21;
          std::vector<llvm::Function*,std::allocator<llvm::Function*>>::
          emplace_back<llvm::Function*>
                    ((vector<llvm::Function*,std::allocator<llvm::Function*>> *)auStack_88,
                     (Function **)local_2f0);
        }
      }
      for (auVar22 = auStack_88; auVar22 != (undefined1  [8])ppFVar4;
          auVar22 = (undefined1  [8])((long)auVar22 + 8)) {
        pFVar20 = *(Function **)auVar22;
        llvm::
        ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
        ::ValueMap((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                    *)local_2f0,0x40);
        pStack_f8.It.UI.U = (user_iterator_impl<llvm::User>)(use_iterator_impl<llvm::Use>)0x0;
        PI.It.UI.U = (user_iterator_impl<llvm::User>)(use_iterator_impl<llvm::Use>)0x0;
        iVar38 = llvm::Function::args(pFVar20);
        for (this_04 = (int  [2])iVar38.begin_iterator; this_04 != (int  [2])iVar38.end_iterator;
            this_04 = (int  [2])((long)this_04 + 0x28)) {
          iVar6 = llvm::Value::getNumUses((Value *)this_04);
          if (iVar6 == 0) {
            pVVar17 = (Value *)llvm::UndefValue::get(*(Type **)this_04);
            p = this_04;
            this_02 = &llvm::
                       ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                       ::operator[]((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                                     *)local_2f0,(Value **)p)->super_ValueHandleBase;
            llvm::ValueHandleBase::operator=(this_02,pVVar17);
          }
        }
        if ((int)p_1.BBs != 0) {
          pFVar33 = (Function *)
                    llvm::CloneFunction(pFVar20,(ValueMap *)local_2f0,(ClonedCodeInfo *)0x0);
          llvm::Function::removeFromParent(pFVar33);
          llvm::
          iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
          ::insertAfter((iplist_impl<llvm::simple_ilist<llvm::Function>,_llvm::SymbolTableListTraits<llvm::Function>_>
                         *)((anonymous_namespace)::M + 0x18),(node_pointer)(pFVar20 + 0x38),pFVar33)
          ;
          auVar39 = llvm::Value::getName((Value *)pFVar20);
          RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
          super__Vector_impl_data._M_start = auVar39._8_8_;
          p = auVar39._0_8_;
          std::__cxx11::string::string<llvm::StringRef,void>
                    ((string *)auStack_58,(StringRef *)p,&local_31);
          llvm::Function::eraseFromParent();
          llvm::Twine::Twine((Twine *)p,(string *)auStack_58);
          llvm::Value::setName((Value *)pFVar33,(Twine *)p);
          std::__cxx11::string::~string((string *)auStack_58);
        }
        std::vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_>::~vector
                  ((vector<llvm::WeakVH,_std::allocator<llvm::WeakVH>_> *)&stack0xffffffffffffff08);
        llvm::
        ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
        ::~ValueMap((ValueMap<const_llvm::Value_*,_llvm::WeakTrackingVH,_llvm::ValueMapConfig<const_llvm::Value_*,_llvm::sys::SmartMutex<false>_>_>
                     *)local_2f0);
      }
      std::_Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_>::~_Vector_base
                ((_Vector_base<llvm::Function_*,_std::allocator<llvm::Function_*>_> *)auStack_88);
    }
    if ((anonymous_namespace)::Verify[0x80] == '\x01') {
      pPVar23 = (Pass *)llvm::createVerifierPass(true);
      llvm::legacy::PassManager::add((PassManager *)local_68,pPVar23);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2f0,"",(allocator<char> *)p);
    pPVar23 = (Pass *)llvm::createPrintModulePass
                                ((raw_ostream *)auStack_168,(string *)local_2f0,false);
    llvm::legacy::PassManager::add((PassManager *)local_68,pPVar23);
    std::__cxx11::string::~string((string *)local_2f0);
    llvm::legacy::PassManager::run((PassManager *)local_68,(anonymous_namespace)::M);
    std::__cxx11::string::string((string *)p,local_128);
    if ((anonymous_namespace)::OneFuncPerFile[0x80] == '\x01') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2f0);
      poVar24 = std::operator<<((ostream *)&p_1.BB,
                                (string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80));
      std::__cxx11::to_string((string *)auStack_58,(anonymous_namespace)::Id);
      std::operator<<(poVar24,(string *)auStack_58);
      std::__cxx11::string::~string((string *)auStack_58);
      uVar15 = std::__cxx11::string::find((string *)p,0x937598);
      std::__cxx11::string::replace
                ((ulong)p,uVar15,(char *)(anonymous_namespace)::BaseName_abi_cxx11_._136_8_);
      std::__cxx11::to_string((string *)&stack0xffffffffffffff08,(anonymous_namespace)::Id);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff08);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_88,".ll");
      std::__cxx11::string::~string((string *)auStack_88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
      iVar6 = open((char *)auStack_58,0xc2,0x180);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2f0);
      poVar24 = std::operator<<((ostream *)&p_1.BB,
                                (string *)((anonymous_namespace)::BaseName_abi_cxx11_ + 0x80));
      std::__cxx11::to_string((string *)auStack_58,(anonymous_namespace)::Id);
      std::operator<<(poVar24,(string *)auStack_58);
      std::__cxx11::string::~string((string *)auStack_58);
      uVar15 = std::__cxx11::string::find((string *)p,0x937598);
      uVar3 = (anonymous_namespace)::BaseName_abi_cxx11_._136_8_;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace((ulong)p,uVar15,(string *)uVar3);
      std::__cxx11::string::~string((string *)auStack_58);
      iVar6 = rand();
      std::__cxx11::to_string
                ((string *)auStack_88,iVar6 % (int)(anonymous_namespace)::NumFiles._128_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      auStack_88,".ll");
      std::__cxx11::string::~string((string *)auStack_88);
      iVar6 = open((char *)auStack_58,0x442,0x180);
    }
    std::__cxx11::string::~string((string *)auStack_58);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2f0);
    if (iVar6 < 2) goto LAB_00265885;
    uVar15 = write(iVar6,(void *)p,
                   (size_t)RealArgsTy.
                           super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
                           super__Vector_impl_data._M_start);
    if ((pointer)(uVar15 & 0xffffffff) ==
        RealArgsTy.super__Vector_base<llvm::Type_*,_std::allocator<llvm::Type_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar6 = close(iVar6);
      if (iVar6 == 0) {
        std::__cxx11::string::~string((string *)p);
        llvm::legacy::PassManager::~PassManager((PassManager *)local_68);
        llvm::raw_ostream::~raw_ostream((raw_ostream *)auStack_168);
        std::__cxx11::string::~string((string *)local_120);
        _Var8 = getpid();
        if (_Var8 == _Var7) {
          close(local_cc);
          read(local_d0,local_2f0,1);
          for (lVar32 = 0; lVar32 != 100; lVar32 = lVar32 + 1) {
            if (*(int *)((long)(anonymous_namespace)::Shmem + lVar32 * 4 + 0x12f8) != 0) {
              prVar25 = (raw_ostream *)llvm::errs();
              prVar25 = llvm::raw_ostream::operator<<
                                  (prVar25,"oops, there are waiting processes at ");
              prVar25 = llvm::raw_ostream::operator<<(prVar25,(int)lVar32);
              llvm::raw_ostream::operator<<(prVar25,"\n");
            }
          }
        }
        llvm::PrettyStackTraceEntry::~PrettyStackTraceEntry
                  ((PrettyStackTraceEntry *)&stack0xfffffffffffffcf0);
        return 0;
      }
      pcVar31 = "res == 0 failed at line __LINE__";
      goto LAB_002658a1;
    }
  }
  pcVar31 = "non-atomic write";
LAB_002658a1:
  anon_unknown.dwarf_232db::die(pcVar31);
  std::__cxx11::string::~string((string *)auStack_58);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_2f0);
  std::__cxx11::string::~string((string *)p);
  llvm::legacy::PassManager::~PassManager((PassManager *)local_68);
  llvm::raw_ostream::~raw_ostream((raw_ostream *)auStack_168);
  std::__cxx11::string::~string((string *)local_120);
  llvm::PrettyStackTraceEntry::~PrettyStackTraceEntry
            ((PrettyStackTraceEntry *)&stack0xfffffffffffffcf0);
  _Unwind_Resume(extraout_RAX);
LAB_0026581b:
  anon_unknown.dwarf_232db::die("pthread_cond_init failed");
LAB_00265827:
  exit(0);
}

Assistant:

int main(int argc, char **argv) {
  PrettyStackTraceProgram X(argc, argv);
  cl::ParseCommandLineOptions(argc, argv, "llvm codegen stress-tester\n");

  if (W < 2)
    die("Width must be >= 2");

  Shmem =
      (struct shared *)::mmap(0, sizeof(struct shared), PROT_READ | PROT_WRITE,
                              MAP_SHARED | MAP_ANON, -1, 0);
  if (Shmem == MAP_FAILED)
    die("mmap failed");
  Shmem->NextId = 1;
  Shmem->Running = 1;
  if (pthread_mutexattr_init(&Shmem->LockAttr) != 0)
    die("pthread_mutexattr_init failed");
  if (pthread_mutexattr_setpshared(&Shmem->LockAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_mutexattr_setpshared failed");
  if (pthread_mutex_init(&Shmem->Lock, &Shmem->LockAttr) != 0)
    die("pthread_mutex_init failed");
  if (pthread_condattr_init(&Shmem->CondAttr) != 0)
    die("pthread_condattr_init failed");
  if (pthread_condattr_setpshared(&Shmem->CondAttr, PTHREAD_PROCESS_SHARED) !=
      0)
    die("pthread_condattr_setpshared failed");
  for (int i = 0; i < MAX_DEPTH; ++i) {
    if (pthread_cond_init(&Shmem->Cond[i], &Shmem->CondAttr) != 0)
      die("pthread_cond_init failed");
    Shmem->Waiting[i] = 0;
  }
  Init = 1;

  int p[2];
  pid_t original_pid = ::getpid();
  if (::atexit(decrease_runners) != 0)
    die("atexit failed");
  /*
   * use a trick from stackoverflow to work around the fact that in
   * UNIX we can only wait on our children, not our extended
   * descendents: all descendents are going to inherit this pipe,
   * implicitly closing its fds when they terminate. at that point
   * reading from the pipe will not block but rather return with EOF
   */
  if (::pipe(p) != 0)
    die("pipe failed??");

  generate();
  output();

  if (::getpid() == original_pid) {
    char buf[1];
    ::close(p[1]);
    ::read(p[0], buf, 1);
    for (int i = 0; i < MAX_DEPTH; i++) {
      if (Shmem->Waiting[i] != 0)
        errs() << "oops, there are waiting processes at " << i << "\n";
    }
  }

  return 0;
}